

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# communicator.cpp
# Opt level: O0

int __thiscall
GGSock::Communicator::connect(Communicator *this,int __fd,sockaddr *__addr,socklen_t __len)

{
  uint uVar1;
  FILE *__stream;
  bool bVar2;
  uint16_t uVar3;
  int iVar4;
  in_addr_t iVar5;
  Data *pDVar6;
  uint *puVar7;
  int *piVar8;
  char *pcVar9;
  hostent *phVar10;
  undefined8 extraout_RAX;
  undefined4 in_register_00000034;
  bool success;
  bool res;
  sockaddr_in *addr;
  int enable;
  hostent *server;
  lock_guard<std::mutex> lock;
  Data *data;
  undefined6 in_stack_ffffffffffffff78;
  undefined1 in_stack_ffffffffffffff7e;
  undefined1 in_stack_ffffffffffffff7f;
  lock_guard<std::mutex> *in_stack_ffffffffffffff80;
  int local_5c;
  sockaddr_in *local_58;
  undefined4 local_50 [2];
  Data *in_stack_ffffffffffffffb8;
  socklen_t local_20;
  undefined4 local_1c;
  undefined8 local_18;
  Communicator *local_10;
  bool local_1;
  
  local_18 = CONCAT44(in_register_00000034,__fd);
  local_1c = SUB84(__addr,0);
  local_20 = __len;
  local_10 = this;
  pDVar6 = getData((Communicator *)0x12cfe3);
  std::lock_guard<std::mutex>::lock_guard
            (in_stack_ffffffffffffff80,
             (mutex_type *)
             CONCAT17(in_stack_ffffffffffffff7f,
                      CONCAT16(in_stack_ffffffffffffff7e,in_stack_ffffffffffffff78)));
  if ((pDVar6->isConnected & 1U) == 0) {
    if ((pDVar6->isConnecting & 1U) == 0) {
      iVar4 = socket(2,1,6);
      pDVar6->sd = iVar4;
      if (pDVar6->sd < 0) {
        anon_unknown.dwarf_7001::closeAndReset((TSocketDescriptor *)0x12d079);
        __stream = _stderr;
        puVar7 = (uint *)__errno_location();
        uVar1 = *puVar7;
        piVar8 = __errno_location();
        pcVar9 = strerror(*piVar8);
        fprintf(__stream,"Error creating socket (%d %s)\n",(ulong)uVar1,pcVar9);
        local_1 = false;
      }
      else {
        local_50[0] = 1;
        iVar4 = setsockopt(pDVar6->sd,1,2,local_50,4);
        if (iVar4 < 0) {
          fprintf(_stderr,"setsockopt(SO_REUSEADDR) failed");
        }
        iVar4 = setsockopt(pDVar6->sd,1,0xf,local_50,4);
        if (iVar4 < 0) {
          fprintf(_stderr,"setsockopt(SO_REUSEPORT) failed");
        }
        anon_unknown.dwarf_7001::setNonBlocking((TSocketDescriptor *)in_stack_ffffffffffffff80);
        pcVar9 = (char *)std::__cxx11::string::c_str();
        phVar10 = gethostbyname(pcVar9);
        if (phVar10 == (hostent *)0x0) {
          fprintf(_stderr,"ERROR, no such host\n");
          local_1 = false;
        }
        else {
          local_58 = &pDVar6->addr;
          local_58->sin_family = 0;
          local_58->sin_port = 0;
          local_58->sin_addr = 0;
          (pDVar6->addr).sin_zero[0] = '\0';
          (pDVar6->addr).sin_zero[1] = '\0';
          (pDVar6->addr).sin_zero[2] = '\0';
          (pDVar6->addr).sin_zero[3] = '\0';
          (pDVar6->addr).sin_zero[4] = '\0';
          (pDVar6->addr).sin_zero[5] = '\0';
          (pDVar6->addr).sin_zero[6] = '\0';
          (pDVar6->addr).sin_zero[7] = '\0';
          local_58->sin_family = 2;
          uVar3 = htons((uint16_t)local_1c);
          local_58->sin_port = uVar3;
          pcVar9 = (char *)std::__cxx11::string::c_str();
          iVar5 = inet_addr(pcVar9);
          (local_58->sin_addr).s_addr = iVar5;
          pDVar6->isServer = false;
          pDVar6->isConnecting = true;
          local_5c = 0;
          piVar8 = std::max<int>(&local_5c,(int *)&local_20);
          pDVar6->timeoutConnect_ms = *piVar8;
          if ((int)local_20 < 1) {
            if ((int)local_20 < 0) {
              pDVar6->timeoutConnect_ms = 1;
              do {
                if ((pDVar6->isConnecting & 1U) == 0) {
                  local_1 = false;
                  goto LAB_0012d332;
                }
                bVar2 = Data::doConnect(in_stack_ffffffffffffffb8);
              } while (!bVar2);
              pDVar6->isConnecting = false;
              local_1 = true;
            }
            else {
              local_1 = true;
            }
          }
          else {
            local_1 = Data::doConnect(in_stack_ffffffffffffffb8);
            pDVar6->isConnecting = false;
          }
        }
      }
    }
    else {
      local_1 = false;
    }
  }
  else {
    local_1 = false;
  }
LAB_0012d332:
  std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)0x12d33c);
  return (uint)CONCAT71((int7)((ulong)extraout_RAX >> 8),local_1) & 0xffffff01;
}

Assistant:

bool Communicator::connect(const TAddress & address, TPort port, int32_t timeout_ms) {
        auto & data = getData();

        std::lock_guard<std::mutex> lock(data.mutex);

        if (data.isConnected) return false;
        if (data.isConnecting) return false;

        struct hostent *server;

        data.sd = socket(AF_INET, SOCK_STREAM, IPPROTO_TCP);
        if (data.sd < 0) {
            ::closeAndReset(data.sd);
            fprintf(stderr, "Error creating socket (%d %s)\n", errno, strerror(errno));
            return false;
        }

        int enable = 1;
        if (setsockopt(data.sd, SOL_SOCKET, SO_REUSEADDR, (char *)&enable, sizeof(int)) < 0) {
            fprintf(stderr, "setsockopt(SO_REUSEADDR) failed");
        }

#ifndef _WIN32
        if (setsockopt(data.sd, SOL_SOCKET, SO_REUSEPORT, (char *)&enable, sizeof(int)) < 0) {
            fprintf(stderr, "setsockopt(SO_REUSEPORT) failed");
        }
#endif

        //{
        //    linger lin;
        //    lin.l_onoff = 0;
        //    lin.l_linger = 0;
        //    if (setsockopt(data.sd, SOL_SOCKET, SO_LINGER, (const char *)&lin, sizeof(lin)) < 0) {
        //        fprintf(stderr, "setsockopt(SO_LINGER) failed");
        //    }
        //}

        ::setNonBlocking(data.sd);

        server = gethostbyname(address.c_str());
        if (server == NULL) {
            fprintf(stderr,"ERROR, no such host\n");
            return false;
        }

        auto & addr = data.addr;
        memset((char *) &addr, '\0', sizeof(addr));

        addr.sin_family = AF_INET;
        addr.sin_port = htons(port);
        addr.sin_addr.s_addr = inet_addr(address.c_str());

        data.isServer = false;
        data.isConnecting = true;

        data.timeoutConnect_ms = (std::max)(0, timeout_ms);
        if (timeout_ms > 0) {
            bool res = data.doConnect();

            data.isConnecting = false;
            return res;
        } else if (timeout_ms < 0) {
            data.timeoutConnect_ms = 1;
            while (data.isConnecting) {
                bool success = data.doConnect();
                if (success) {
                    data.isConnecting = false;
                    return true;
                }
            }
            return false;
        }

        return true;
    }